

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  long lVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  void *pvVar8;
  ImGuiTable *table;
  void *pvVar9;
  long lVar10;
  ImGuiContext *pIVar11;
  uint uVar12;
  int iVar13;
  ImGuiContext *ctx;
  ImGuiContext *pIVar14;
  void *pvVar15;
  bool *pbVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int i;
  long lVar20;
  undefined8 *puVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  ImGuiListClipperRange local_48;
  void *local_38;
  
  pIVar11 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  pvVar8 = this->TempData;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  pIVar14 = GImGui;
  uVar26 = this->ItemsCount;
  if (uVar26 == 0) goto LAB_0010a589;
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    pbVar16 = &GImGui->CurrentWindow->SkipItems;
  }
  else {
    pbVar16 = &GImGui->CurrentTable->HostSkipItems;
  }
  if (*pbVar16 == true) goto LAB_0010a589;
  bVar27 = *(int *)((long)pvVar8 + 0xc) == 0;
  if ((bVar27 && table != (ImGuiTable *)0x0) && (table->IsUnfrozenRows == false)) {
    iVar6 = *(int *)((long)pvVar8 + 0x10);
    this->DisplayStart = iVar6;
    this->DisplayEnd = iVar6 + 1;
    if (iVar6 < (int)uVar26) {
      *(int *)((long)pvVar8 + 0x10) = iVar6 + 1;
      return true;
    }
    goto LAB_0010a589;
  }
  if ((*(int *)((long)pvVar8 + 0xc) == 0) &&
     (this->StartPosY = (pIVar7->DC).CursorPos.y, this->ItemsHeight <= 0.0)) {
    local_48.Max = *(int *)((long)pvVar8 + 0x10) + 1;
    local_48.Min = *(int *)((long)pvVar8 + 0x10);
    local_48.PosToIndexConvert = false;
    local_48.PosToIndexOffsetMin = '\0';
    local_48.PosToIndexOffsetMax = '\0';
    local_48._11_1_ = 0;
    ImVector<ImGuiListClipperRange>::push_front
              ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_48);
    piVar2 = *(int **)((long)pvVar8 + 0x20);
    iVar6 = *piVar2;
    iVar13 = *(int *)((long)pvVar8 + 0x10);
    if (*(int *)((long)pvVar8 + 0x10) < iVar6) {
      iVar13 = iVar6;
    }
    this->DisplayStart = iVar13;
    iVar6 = piVar2[1];
    iVar25 = this->ItemsCount;
    if (iVar6 < this->ItemsCount) {
      iVar25 = iVar6;
    }
    this->DisplayEnd = iVar25;
    if (iVar13 != iVar25) {
      *(undefined4 *)((long)pvVar8 + 0xc) = 1;
      return true;
    }
    goto LAB_0010a589;
  }
  if (this->ItemsHeight <= 0.0) {
    fVar3 = (pIVar7->DC).CursorPos.y;
    this->ItemsHeight = (fVar3 - this->StartPosY) / (float)(this->DisplayEnd - this->DisplayStart);
    bVar27 = true;
    if ((16777216.0 <= ABS(this->StartPosY)) || (16777216.0 <= ABS(fVar3))) {
      this->ItemsHeight = (pIVar7->DC).PrevLineSize.y + (pIVar11->Style).ItemSpacing.y;
    }
  }
  iVar6 = this->DisplayEnd;
  if (bVar27) {
    if (pIVar11->LogEnabled == true) {
      lVar24 = (ulong)uVar26 << 0x20;
      iVar13 = *(int *)((long)pvVar8 + 0x1c);
      uVar26 = 0;
      if (*(int *)((long)pvVar8 + 0x18) == iVar13) {
        iVar25 = *(int *)((long)pvVar8 + 0x18) + 1;
        if (iVar13 == 0) {
          iVar17 = 8;
        }
        else {
          iVar17 = iVar13 / 2 + iVar13;
        }
        if (iVar25 < iVar17) {
          iVar25 = iVar17;
        }
        uVar26 = 0;
        uVar12 = 0;
        if (iVar13 < iVar25) {
LAB_0010a9a0:
          uVar26 = uVar12;
          if (pIVar14 != (ImGuiContext *)0x0) {
            piVar2 = &(pIVar14->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + 1;
          }
          pvVar15 = (*GImAllocatorAllocFunc)((long)iVar25 * 0xc,GImAllocatorUserData);
          if (*(void **)((long)pvVar8 + 0x20) != (void *)0x0) {
            memcpy(pvVar15,*(void **)((long)pvVar8 + 0x20),(long)*(int *)((long)pvVar8 + 0x18) * 0xc
                  );
            pvVar9 = *(void **)((long)pvVar8 + 0x20);
            if ((pvVar9 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + -1;
            }
            (*GImAllocatorFreeFunc)(pvVar9,GImAllocatorUserData);
          }
          *(void **)((long)pvVar8 + 0x20) = pvVar15;
          *(int *)((long)pvVar8 + 0x1c) = iVar25;
        }
      }
    }
    else {
      if ((pIVar11->NavMoveScoringItems == true) && (pIVar11->NavWindow != (ImGuiWindow *)0x0)) {
        bVar27 = pIVar11->NavWindow->RootWindowForNav == pIVar7->RootWindowForNav;
      }
      else {
        bVar27 = false;
      }
      if (bVar27) {
        fVar3 = (pIVar11->NavScoringNoClipRect).Min.y;
        fVar4 = (pIVar11->NavScoringNoClipRect).Max.y;
        iVar13 = *(int *)((long)pvVar8 + 0x1c);
        if (*(int *)((long)pvVar8 + 0x18) == iVar13) {
          iVar25 = *(int *)((long)pvVar8 + 0x18) + 1;
          if (iVar13 == 0) {
            iVar17 = 8;
          }
          else {
            iVar17 = iVar13 / 2 + iVar13;
          }
          if (iVar25 < iVar17) {
            iVar25 = iVar17;
          }
          if (iVar13 < iVar25) {
            if (pIVar14 != (ImGuiContext *)0x0) {
              piVar2 = &(pIVar14->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + 1;
            }
            pvVar15 = (*GImAllocatorAllocFunc)((long)iVar25 * 0xc,GImAllocatorUserData);
            if (*(void **)((long)pvVar8 + 0x20) != (void *)0x0) {
              local_38 = pvVar15;
              memcpy(pvVar15,*(void **)((long)pvVar8 + 0x20),
                     (long)*(int *)((long)pvVar8 + 0x18) * 0xc);
              pvVar15 = *(void **)((long)pvVar8 + 0x20);
              if ((pvVar15 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + -1;
              }
              (*GImAllocatorFreeFunc)(pvVar15,GImAllocatorUserData);
              pvVar15 = local_38;
            }
            *(void **)((long)pvVar8 + 0x20) = pvVar15;
            *(int *)((long)pvVar8 + 0x1c) = iVar25;
          }
        }
        lVar24 = *(long *)((long)pvVar8 + 0x20);
        iVar13 = *(int *)((long)pvVar8 + 0x18);
        *(ulong *)(lVar24 + (long)iVar13 * 0xc) = CONCAT44((int)fVar4,(int)fVar3);
        *(undefined4 *)(lVar24 + 8 + (long)iVar13 * 0xc) = 1;
        *(int *)((long)pvVar8 + 0x18) = *(int *)((long)pvVar8 + 0x18) + 1;
        if (((pIVar11->NavMoveFlags & 0x400) != 0) && (pIVar11->NavTabbingDir == -1)) {
          local_48.Min = this->ItemsCount + -1;
          local_48.Max = this->ItemsCount;
          local_48.PosToIndexConvert = false;
          local_48.PosToIndexOffsetMin = '\0';
          local_48.PosToIndexOffsetMax = '\0';
          local_48._11_1_ = 0;
          ImVector<ImGuiListClipperRange>::push_back
                    ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_48);
        }
      }
      if ((pIVar11->NavId != 0) && (pIVar7->NavLastIds[0] == pIVar11->NavId)) {
        fVar3 = (pIVar7->DC).CursorStartPos.y;
        local_48.Min = (int)(pIVar7->NavRectRel[0].Min.y + fVar3);
        local_48.Max = (int)(fVar3 + pIVar7->NavRectRel[0].Max.y);
        local_48.PosToIndexConvert = true;
        local_48.PosToIndexOffsetMin = '\0';
        local_48.PosToIndexOffsetMax = '\0';
        local_48._11_1_ = 0;
        ImVector<ImGuiListClipperRange>::push_back
                  ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_48);
      }
      uVar26 = 1;
      if (bVar27) {
        uVar26 = 1;
        if (pIVar11->NavMoveClipDir == 2) {
          uVar26 = 0xff01;
        }
      }
      uVar12 = 0;
      if (bVar27) {
        uVar12 = (uint)(pIVar11->NavMoveClipDir == 3) << 0x10;
      }
      uVar26 = uVar26 | uVar12;
      lVar24 = CONCAT44((int)(pIVar7->ClipRect).Max.y,(int)(pIVar7->ClipRect).Min.y);
      iVar13 = *(int *)((long)pvVar8 + 0x1c);
      if (*(int *)((long)pvVar8 + 0x18) == iVar13) {
        iVar25 = *(int *)((long)pvVar8 + 0x18) + 1;
        if (iVar13 == 0) {
          iVar17 = 8;
        }
        else {
          iVar17 = iVar13 / 2 + iVar13;
        }
        if (iVar25 < iVar17) {
          iVar25 = iVar17;
        }
        pIVar14 = GImGui;
        uVar12 = uVar26;
        if (iVar13 < iVar25) goto LAB_0010a9a0;
      }
    }
    lVar19 = *(long *)((long)pvVar8 + 0x20);
    iVar13 = *(int *)((long)pvVar8 + 0x18);
    *(long *)(lVar19 + (long)iVar13 * 0xc) = lVar24;
    *(uint *)(lVar19 + 8 + (long)iVar13 * 0xc) = uVar26;
    iVar13 = *(int *)((long)pvVar8 + 0x18) + 1;
    *(int *)((long)pvVar8 + 0x18) = iVar13;
    if (0 < (long)iVar13) {
      lVar24 = *(long *)((long)pvVar8 + 0x20);
      fVar3 = this->ItemsHeight;
      iVar25 = this->ItemsCount;
      lVar19 = 0;
      do {
        if (*(char *)(lVar24 + 8 + lVar19) == '\x01') {
          fVar4 = (pIVar7->DC).CursorPos.y;
          fVar5 = *(float *)((long)pvVar8 + 8);
          iVar22 = *(char *)(lVar24 + 9 + lVar19) + iVar6 +
                   (int)((((float)*(int *)(lVar24 + lVar19) - fVar4) - fVar5) / fVar3);
          iVar17 = iVar25 + -1;
          if (iVar22 < iVar25 + -1) {
            iVar17 = iVar22;
          }
          if (iVar22 < iVar6) {
            iVar17 = iVar6;
          }
          *(int *)(lVar24 + lVar19) = iVar17;
          iVar23 = *(char *)(lVar24 + 10 + lVar19) + iVar6 +
                   (int)((((float)*(int *)(lVar24 + 4 + lVar19) - fVar4) - fVar5) / fVar3 + 0.999999
                        );
          iVar22 = iVar25;
          if (iVar23 < iVar25) {
            iVar22 = iVar23;
          }
          if (iVar23 <= iVar17) {
            iVar22 = iVar17 + 1;
          }
          *(int *)(lVar24 + 4 + lVar19) = iVar22;
          *(undefined1 *)(lVar24 + 8 + lVar19) = 0;
        }
        lVar19 = lVar19 + 0xc;
      } while ((long)iVar13 * 0xc != lVar19);
    }
    iVar25 = *(int *)((long)pvVar8 + 0xc);
    if (1 < iVar13 - iVar25) {
      lVar24 = (long)iVar25;
      uVar18 = (ulong)(uint)(iVar13 - iVar25);
      do {
        lVar19 = lVar24 * 0xc;
        lVar20 = lVar24;
        do {
          lVar10 = *(long *)((long)pvVar8 + 0x20);
          if (*(int *)(lVar10 + 0xc + lVar19) < *(int *)(lVar10 + lVar19)) {
            lVar1 = lVar10 + lVar19;
            puVar21 = (undefined8 *)(lVar10 + lVar19);
            local_48._8_4_ = *(undefined4 *)(puVar21 + 1);
            local_48._0_8_ = *puVar21;
            *(undefined4 *)(puVar21 + 1) = *(undefined4 *)(lVar1 + 0x14);
            *puVar21 = *(undefined8 *)(lVar1 + 0xc);
            *(undefined4 *)(lVar1 + 0x14) = local_48._8_4_;
            *(undefined8 *)(lVar1 + 0xc) = local_48._0_8_;
          }
          lVar20 = lVar20 + 1;
          lVar19 = lVar19 + 0xc;
        } while (lVar20 < (long)(uVar18 + lVar24 + -1));
        bVar27 = 2 < (long)uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar27);
      while( true ) {
        iVar17 = iVar25;
        iVar25 = iVar17 + 1;
        iVar13 = *(int *)((long)pvVar8 + 0x18);
        if (iVar13 <= iVar25) break;
        lVar24 = *(long *)((long)pvVar8 + 0x20);
        iVar22 = *(int *)(lVar24 + 4 + (long)iVar17 * 0xc);
        uVar18 = (ulong)iVar25;
        iVar23 = *(int *)(lVar24 + uVar18 * 0xc);
        if (iVar23 <= iVar22) {
          piVar2 = (int *)(lVar24 + (long)iVar17 * 0xc);
          pvVar15 = (void *)(lVar24 + uVar18 * 0xc);
          if (*piVar2 < iVar23) {
            iVar23 = *piVar2;
          }
          *piVar2 = iVar23;
          iVar25 = *(int *)((long)pvVar15 + 4);
          if (*(int *)((long)pvVar15 + 4) < iVar22) {
            iVar25 = iVar22;
          }
          piVar2[1] = iVar25;
          memmove(pvVar15,(void *)((long)pvVar15 + 0xc),(~uVar18 + (long)iVar13) * 0xc);
          *(int *)((long)pvVar8 + 0x18) = *(int *)((long)pvVar8 + 0x18) + -1;
          iVar25 = iVar17;
        }
      }
    }
  }
  iVar13 = *(int *)((long)pvVar8 + 0xc);
  if (iVar13 < *(int *)((long)pvVar8 + 0x18)) {
    lVar24 = *(long *)((long)pvVar8 + 0x20);
    iVar25 = *(int *)(lVar24 + (long)iVar13 * 0xc);
    iVar17 = iVar6;
    if (iVar6 < iVar25) {
      iVar17 = iVar25;
    }
    this->DisplayStart = iVar17;
    iVar13 = *(int *)(lVar24 + 4 + (long)iVar13 * 0xc);
    iVar22 = this->ItemsCount;
    if (iVar13 < this->ItemsCount) {
      iVar22 = iVar13;
    }
    this->DisplayEnd = iVar22;
    if (iVar6 < iVar25) {
      ImGuiListClipper_SeekCursorForItem(this,iVar17);
    }
    *(int *)((long)pvVar8 + 0xc) = *(int *)((long)pvVar8 + 0xc) + 1;
    return true;
  }
  if (this->ItemsCount != 0x7fffffff) {
    ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
  }
LAB_0010a589:
  End(this);
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(data != NULL && "Called ImGuiListClipper::Step() too many times, or before ImGuiListClipper::Begin() ?");

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
        return (void)End(), false;

    // While we are in frozen row state, keep displaying items one by one, unclipped
    // FIXME: Could be stored as a table-agnostic state.
    if (data->StepNo == 0 && table != NULL && !table->IsUnfrozenRows)
    {
        DisplayStart = data->ItemsFrozen;
        DisplayEnd = data->ItemsFrozen + 1;
        if (DisplayStart >= ItemsCount)
            return (void)End(), false;
        data->ItemsFrozen++;
        return true;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    bool calc_clipping = false;
    if (data->StepNo == 0)
    {
        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item (or range) so we can measure its height (generally the first range is 0..1)
            data->Ranges.push_front(ImGuiListClipperRange::FromIndices(data->ItemsFrozen, data->ItemsFrozen + 1));
            DisplayStart = ImMax(data->Ranges[0].Min, data->ItemsFrozen);
            DisplayEnd = ImMin(data->Ranges[0].Max, ItemsCount);
            if (DisplayStart == DisplayEnd)
                return (void)End(), false;
            data->StepNo = 1;
            return true;
        }
        calc_clipping = true;   // If on the first step with known item height, calculate clipping.
    }

    // Step 1: Let the clipper infer height from first range
    if (ItemsHeight <= 0.0f)
    {
        IM_ASSERT(data->StepNo == 1);
        if (table)
            IM_ASSERT(table->RowPosY1 == StartPosY && table->RowPosY2 == window->DC.CursorPos.y);

        ItemsHeight = (window->DC.CursorPos.y - StartPosY) / (float)(DisplayEnd - DisplayStart);
        bool affected_by_floating_point_precision = ImIsFloatAboveGuaranteedIntegerPrecision(StartPosY) || ImIsFloatAboveGuaranteedIntegerPrecision(window->DC.CursorPos.y);
        if (affected_by_floating_point_precision)
            ItemsHeight = window->DC.PrevLineSize.y + g.Style.ItemSpacing.y; // FIXME: Technically wouldn't allow multi-line entries.

        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        calc_clipping = true;   // If item height had to be calculated, calculate clipping afterwards.
    }

    // Step 0 or 1: Calculate the actual ranges of visible elements.
    const int already_submitted = DisplayEnd;
    if (calc_clipping)
    {
        if (g.LogEnabled)
        {
            // If logging is active, do not perform any clipping
            data->Ranges.push_back(ImGuiListClipperRange::FromIndices(0, ItemsCount));
        }
        else
        {
            // Add range selected to be included for navigation
            const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
            if (is_nav_request)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(g.NavScoringNoClipRect.Min.y, g.NavScoringNoClipRect.Max.y, 0, 0));
            if (is_nav_request && (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && g.NavTabbingDir == -1)
                data->Ranges.push_back(ImGuiListClipperRange::FromIndices(ItemsCount - 1, ItemsCount));

            // Add focused/active item
            ImRect nav_rect_abs = ImGui::WindowRectRelToAbs(window, window->NavRectRel[0]);
            if (g.NavId != 0 && window->NavLastIds[0] == g.NavId)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(nav_rect_abs.Min.y, nav_rect_abs.Max.y, 0, 0));

            // Add visible range
            const int off_min = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up) ? -1 : 0;
            const int off_max = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down) ? 1 : 0;
            data->Ranges.push_back(ImGuiListClipperRange::FromPositions(window->ClipRect.Min.y, window->ClipRect.Max.y, off_min, off_max));
        }

        // Convert position ranges to item index ranges
        // - Very important: when a starting position is after our maximum item, we set Min to (ItemsCount - 1). This allows us to handle most forms of wrapping.
        // - Due to how Selectable extra padding they tend to be "unaligned" with exact unit in the item list,
        //   which with the flooring/ceiling tend to lead to 2 items instead of one being submitted.
        for (int i = 0; i < data->Ranges.Size; i++)
            if (data->Ranges[i].PosToIndexConvert)
            {
                int m1 = (int)(((double)data->Ranges[i].Min - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight);
                int m2 = (int)((((double)data->Ranges[i].Max - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight) + 0.999999f);
                data->Ranges[i].Min = ImClamp(already_submitted + m1 + data->Ranges[i].PosToIndexOffsetMin, already_submitted, ItemsCount - 1);
                data->Ranges[i].Max = ImClamp(already_submitted + m2 + data->Ranges[i].PosToIndexOffsetMax, data->Ranges[i].Min + 1, ItemsCount);
                data->Ranges[i].PosToIndexConvert = false;
            }
        ImGuiListClipper_SortAndFuseRanges(data->Ranges, data->StepNo);
    }

    // Step 0+ (if item height is given in advance) or 1+: Display the next range in line.
    if (data->StepNo < data->Ranges.Size)
    {
        DisplayStart = ImMax(data->Ranges[data->StepNo].Min, already_submitted);
        DisplayEnd = ImMin(data->Ranges[data->StepNo].Max, ItemsCount);
        if (DisplayStart > already_submitted) //-V1051
            ImGuiListClipper_SeekCursorForItem(this, DisplayStart);
        data->StepNo++;
        return true;
    }

    // After the last step: Let the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (ItemsCount < INT_MAX)
        ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

    End();
    return false;
}